

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O3

image * load_png_image_from_file(FILE *fp)

{
  byte bVar1;
  void *__ptr;
  byte bVar2;
  char cVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  __jmp_buf_tag *__env;
  image *image;
  void *pvVar8;
  image *piVar9;
  size_t sVar10;
  FILE *__stream;
  undefined7 extraout_var;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  long *plVar15;
  char *__filename;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  char *__size;
  png_structp png_ptr;
  png_infop info_ptr;
  char sig [8];
  long local_70;
  byte local_61;
  long local_60;
  uint local_54;
  ulong local_50;
  void *local_48;
  image *local_40;
  undefined1 local_38 [8];
  
  fread(local_38,1,8,(FILE *)fp);
  iVar5 = png_sig_cmp(local_38,0,8);
  if (iVar5 != 0) {
    return (image *)0x0;
  }
  local_70 = png_create_read_struct("1.6.37",0,0,0);
  if (local_70 == 0) {
    return (image *)0x0;
  }
  local_60 = png_create_info_struct(local_70);
  if (local_60 == 0) {
    plVar15 = (long *)0x0;
  }
  else {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_70,longjmp,200);
    iVar5 = _setjmp(__env);
    if (iVar5 == 0) {
      png_set_sig_bytes(local_70,8);
      png_init_io(local_70,fp);
      png_read_info(local_70,local_60);
      uVar6 = png_get_image_width(local_70,local_60);
      uVar7 = png_get_image_height(local_70,local_60);
      bVar2 = png_get_color_type(local_70,local_60);
      cVar3 = png_get_bit_depth(local_70,local_60);
      if (bVar2 == 3) {
        png_set_palette_to_rgb(local_70);
      }
      else if ((bVar2 & 0xfb) == 0) {
        png_set_gray_to_rgb(local_70);
      }
      uVar20 = (ulong)uVar7;
      if (cVar3 == '\x10') {
        png_set_strip_16(local_70);
      }
      iVar5 = png_get_valid(local_70,local_60,0x10);
      if (iVar5 == 0) {
        uVar12 = (uint)(bVar2 >> 2);
      }
      else {
        png_set_tRNS_to_alpha(local_70);
        uVar12 = 1;
      }
      if (uVar20 == 0) {
LAB_001076c5:
        image = (image *)0x0;
      }
      else {
        image = (image *)malloc(uVar20 * 8);
        if (image == (image *)0x0) {
          load_png_image_from_file_cold_1();
          goto LAB_001076c5;
        }
      }
      uVar18 = (ulong)uVar6;
      sVar14 = (ulong)(uVar12 & 1) + 3;
      lVar19 = sVar14 * uVar18;
      if (lVar19 * uVar20 == 0) {
LAB_00107702:
        local_48 = (void *)0x0;
      }
      else {
        local_48 = malloc(lVar19 * uVar20);
        if (local_48 == (void *)0x0) {
          load_png_image_from_file_cold_2();
          goto LAB_00107702;
        }
      }
      if (uVar7 != 0) {
        uVar11 = 0;
        pvVar8 = local_48;
        do {
          (&image->width)[uVar11] = (size_t)pvVar8;
          uVar11 = uVar11 + 1;
          pvVar8 = (void *)((long)pvVar8 + lVar19);
        } while (uVar20 != uVar11);
      }
      local_61 = (byte)uVar12;
      local_54 = uVar7;
      local_40 = image;
      png_read_image(local_70);
      __filename = (char *)(sVar14 * 8 + 0x18);
      piVar9 = (image *)malloc((size_t)__filename);
      if (piVar9 == (image *)0x0) {
LAB_00107900:
        load_png_image_from_file_cold_4();
        if ((image->channel_count - 3 < 2) &&
           (__stream = fopen(__filename,"wb"), __stream != (FILE *)0x0)) {
          _Var4 = save_png_image_to_file((FILE *)__stream,image);
          piVar9 = (image *)(CONCAT71(extraout_var,_Var4) & 0xffffffff);
          fclose(__stream);
        }
        else {
          piVar9 = (image *)0x0;
        }
        return piVar9;
      }
      piVar9->width = uVar18;
      piVar9->height = uVar20;
      piVar9->channel_count = sVar14;
      __size = (char *)(uVar18 * uVar20 * 4);
      sVar10 = 0;
      local_50 = uVar18;
      do {
        if (__size == (char *)0x0) {
          pvVar8 = (void *)0x0;
        }
        else {
          __filename = __size;
          pvVar8 = malloc((size_t)__size);
          if (pvVar8 == (void *)0x0) {
            load_png_image_from_file_cold_3();
            goto LAB_00107900;
          }
        }
        __ptr = local_48;
        (&piVar9[1].width)[sVar10] = (size_t)pvVar8;
        sVar10 = sVar10 + 1;
      } while (sVar14 != sVar10);
      if (local_54 != 0) {
        lVar16 = (long)local_48 + 2;
        uVar11 = 0;
        uVar18 = uVar11;
        do {
          if ((local_61 & 1) == 0) {
            if ((int)local_50 != 0) {
LAB_001078dc:
              __assert_fail("x < image->width && y < image->height && image->channel_count >= 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                            ,0x58,
                            "void set_rgba_pixel(struct image *, size_t, size_t, const struct rgba *)"
                           );
            }
          }
          else if ((int)local_50 != 0) {
            lVar13 = 0;
            uVar17 = uVar11;
            do {
              if ((local_50 * 3 == lVar13) || (uVar20 <= uVar18)) goto LAB_001078dc;
              bVar2 = *(byte *)(lVar16 + lVar13);
              bVar1 = *(byte *)(lVar16 + -1 + lVar13);
              *(float *)(piVar9[1].width + uVar17) =
                   (float)*(byte *)(lVar16 + -2 + lVar13) * 0.003921569;
              *(float *)(piVar9[1].height + uVar17) = (float)bVar1 * 0.003921569;
              *(float *)(piVar9[1].channel_count + uVar17) = (float)bVar2 * 0.003921569;
              *(undefined4 *)(piVar9[2].width + uVar17) = 0;
              lVar13 = lVar13 + 3;
              uVar17 = uVar17 + 4;
            } while (local_50 * 3 != lVar13);
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + lVar19;
          uVar11 = uVar11 + local_50 * 4;
        } while (uVar18 != uVar20);
      }
      free(local_40);
      free(__ptr);
      plVar15 = &local_60;
      goto LAB_001078c2;
    }
    plVar15 = &local_60;
  }
  piVar9 = (image *)0x0;
LAB_001078c2:
  png_destroy_read_struct(&local_70,plVar15,0);
  return piVar9;
}

Assistant:

static struct image* load_png_image_from_file(FILE* fp) {
    char sig[8];
    fread(sig, 1, 8, fp);
    if (!png_check_sig((unsigned char*)sig, 8))
        return NULL;

    png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return NULL;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return NULL;
    }

    struct image* image = NULL;
    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (image)     free_image(image);
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
        return NULL;
    }

    png_set_sig_bytes(png_ptr, 8);
    png_init_io(png_ptr, fp);
    png_read_info(png_ptr, info_ptr);

    size_t width  = png_get_image_width(png_ptr, info_ptr);
    size_t height = png_get_image_height(png_ptr, info_ptr);

    png_uint_32 color_type = png_get_color_type(png_ptr, info_ptr);
    png_uint_32 bit_depth  = png_get_bit_depth(png_ptr, info_ptr);

    // Expand paletted and grayscale images to RGB
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png_ptr);
    else if (
        color_type == PNG_COLOR_TYPE_GRAY ||
        color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
        png_set_gray_to_rgb(png_ptr);

    // Transform to 8 bit per channel
    if (bit_depth == 16)
        png_set_strip_16(png_ptr);

    // Get alpha channel when there is one
    bool has_alpha = color_type & PNG_COLOR_MASK_ALPHA;
    if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
        png_set_tRNS_to_alpha(png_ptr);
        has_alpha = true;
    }

    size_t channel_count = has_alpha ? 4 : 3;
    size_t stride = width * channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * height);
    for (size_t i = 0; i < height; ++i)
        row_ptrs[i] = row_bytes + stride * i;
    png_read_image(png_ptr, row_ptrs);

    // Transform the byte data into a floating point image
    image = new_image(width, height, channel_count);
    for (size_t i = 0; i < height; ++i) {
        const png_byte* row = row_bytes + stride * i;
        const real_t scale = (real_t)1 / (real_t)255;
        if (has_alpha) {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 3 + 0] * scale,
                    .g = (real_t)row[j * 3 + 1] * scale,
                    .b = (real_t)row[j * 3 + 2] * scale,
                });
            }
        } else {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 4 + 0] * scale,
                    .g = (real_t)row[j * 4 + 1] * scale,
                    .b = (real_t)row[j * 4 + 2] * scale,
                    .a = (real_t)row[j * 4 + 3] * scale
                });
            }
        }
    }
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    return image;
}